

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O2

void Abc_QuickSort2Dec_rec(word *pData,int l,int r)

{
  word wVar1;
  word wVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
LAB_003e1105:
  iVar4 = r - l;
  if (iVar4 == 0 || r < l) {
    return;
  }
  if (iVar4 < 10) {
    Abc_SelectSortDec(pData + l,iVar4 + 1);
    return;
  }
  wVar1 = pData[r];
  uVar8 = (ulong)(l - 1);
  uVar6 = (ulong)(uint)r;
  do {
    uVar8 = (long)(int)uVar8;
    do {
      uVar7 = uVar8;
      wVar2 = pData[uVar7 + 1];
      uVar8 = uVar7 + 1;
    } while ((uint)wVar1 < (uint)wVar2);
    uVar5 = (long)(int)uVar6;
    do {
      lVar3 = uVar5 - 1;
      uVar6 = uVar5 - 1;
      if (l + 1 == (int)uVar5) break;
      uVar5 = uVar6;
    } while ((uint)pData[lVar3] < (uint)wVar1);
    if ((long)uVar6 <= (long)uVar8) break;
    pData[uVar8] = pData[lVar3];
    pData[uVar6] = wVar2;
  } while( true );
  pData[uVar8] = pData[r];
  pData[r] = wVar2;
  Abc_QuickSort2Dec_rec(pData,l,(int)uVar7);
  l = (int)uVar7 + 2;
  goto LAB_003e1105;
}

Assistant:

void Abc_QuickSort2Dec_rec( word * pData, int l, int r )
{
    word v = pData[r];
    int i = l-1, j = r;
    if ( l >= r )
        return;
    assert( l < r );
    if ( r - l < 10 )
    {
        Abc_SelectSortDec( pData + l, r - l + 1 );
        return;
    }
    while ( 1 )
    {
        while ( (unsigned)pData[++i] > (unsigned)v );
        while ( (unsigned)v > (unsigned)pData[--j] )
            if ( j == l )
                break;
        if ( i >= j )
            break;
        ABC_SWAP( word, pData[i], pData[j] );
    }
    ABC_SWAP( word, pData[i], pData[r] ); 
    Abc_QuickSort2Dec_rec( pData, l, i-1 );
    Abc_QuickSort2Dec_rec( pData, i+1, r );
}